

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidget::setFont(QWidget *this,QFont *font)

{
  QWidgetPrivate *this_00;
  QWExtra *pQVar1;
  long lVar2;
  QStyleSheetStyle *this_01;
  QObject *object;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  pQVar1 = (this_00->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar1 != (QWExtra *)0x0) {
    lVar2 = (long)(pQVar1->style).wp.d;
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      object = (QObject *)0x0;
    }
    else {
      object = *(QObject **)((long)&(pQVar1->style).wp + 8);
    }
    this_01 = QtPrivate::qobject_cast_helper<QStyleSheetStyle*,QObject>(object);
    if (this_01 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::saveWidgetFont((QStyleSheetStyle *)this_01,this,font);
    }
  }
  setAttribute(this,WA_SetFont,*(int *)(font + 8) != 0);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetPrivate::naturalWidgetFont((QWidgetPrivate *)&local_38,(uint)this_00);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::resolve((QFont *)&local_48);
  QWidgetPrivate::setFont_helper(this_00,(QFont *)&local_48);
  QFont::~QFont((QFont *)&local_48);
  QFont::~QFont((QFont *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setFont(const QFont &font)
{
    Q_D(QWidget);

#ifndef QT_NO_STYLE_STYLESHEET
    const QStyleSheetStyle* style;
    if (d->extra && (style = qt_styleSheet(d->extra->style)))
        style->saveWidgetFont(this, font);
#endif

    setAttribute(Qt::WA_SetFont, font.resolveMask() != 0);

    // Determine which font is inherited from this widget's ancestors and
    // QApplication::font, resolve this against \a font (attributes from the
    // inherited font are copied over). Then propagate this font to this
    // widget's children.
    QFont naturalFont = d->naturalWidgetFont(d->inheritedFontResolveMask);
    QFont resolvedFont = font.resolve(naturalFont);
    d->setFont_helper(resolvedFont);
}